

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

_Bool parse_vrp_file(Instance *instance,FILE *filehandle,char *filepath)

{
  _Bool _Var1;
  char cVar2;
  int iVar3;
  int32_t iVar4;
  size_t __n;
  char *__ptr;
  size_t sVar5;
  double *pdVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  double dVar13;
  int32_t num_vehicles;
  VrplibParser local_d8;
  anon_struct_24_4_1626e806 sections [5];
  
  bVar11 = false;
  fseek((FILE *)filehandle,0,2);
  __n = ftell((FILE *)filehandle);
  fseek((FILE *)filehandle,0,0);
  __ptr = (char *)malloc(__n + 1);
  if (__ptr == (char *)0x0) goto LAB_00103ef1;
  sVar5 = fread(__ptr,1,__n,(FILE *)filehandle);
  if (sVar5 == __n) {
    __ptr[__n] = '\0';
    local_d8.curline = 0;
    local_d8._28_4_ = 0;
    local_d8._40_8_ = 0;
    bVar11 = true;
    bVar12 = false;
    local_d8.filename = filepath;
    local_d8.base = __ptr;
    local_d8.at = __ptr;
    local_d8.size = __n;
    do {
      if ((bVar12) || ((long)local_d8.base - (long)local_d8.at == -local_d8.size)) break;
      parser_eat_all_blanks(&local_d8);
      _Var1 = parser_match_string(&local_d8,"#");
      if (_Var1) {
        pcVar7 = local_d8.base + (local_d8.size - (long)local_d8.at);
        pcVar9 = local_d8.at;
        do {
          local_d8.at = pcVar9;
          bVar12 = pcVar7 == (char *)0x0;
          pcVar7 = pcVar7 + -1;
          if ((bVar12) || (*local_d8.at == '\n')) break;
          pcVar9 = local_d8.at + 1;
        } while (*local_d8.at != '\r');
        parser_eat_newline(&local_d8);
        parser_eat_whitespaces(&local_d8);
        bVar12 = false;
LAB_00103994:
        pcVar9 = (char *)0x0;
      }
      else {
        pcVar9 = parse_hdr_field(&local_d8,"NAME");
        if (pcVar9 == (char *)0x0) {
          pcVar9 = parse_hdr_field(&local_d8,"COMMENT");
          if (pcVar9 == (char *)0x0) {
            pcVar9 = parse_hdr_field(&local_d8,"TYPE");
            if (pcVar9 == (char *)0x0) {
              pcVar9 = parse_hdr_field(&local_d8,"DIMENSION");
              if (pcVar9 == (char *)0x0) {
                pcVar9 = parse_hdr_field(&local_d8,"VEHICLES");
                if (pcVar9 != (char *)0x0) {
                  _num_vehicles = (double)((ulong)_num_vehicles & 0xffffffff00000000);
                  _Var1 = str_to_int32(pcVar9,&num_vehicles);
                  if (!_Var1) {
                    bVar11 = false;
                    parse_error(&local_d8,
                                "expected valid integer for VEHICLES field. Got `%s` instead",pcVar9
                               );
                  }
                  bVar12 = false;
                  iVar4 = num_vehicles;
                  if (num_vehicles < 1) {
                    iVar4 = 0;
                  }
                  instance->num_vehicles = iVar4;
                  goto LAB_001039c2;
                }
                pcVar9 = parse_hdr_field(&local_d8,"EDGE_WEIGHT_TYPE");
                if (pcVar9 == (char *)0x0) {
                  pcVar9 = parse_hdr_field(&local_d8,"EDGE_WEIGHT_FORMAT");
                  if (pcVar9 == (char *)0x0) {
                    pcVar9 = parse_hdr_field(&local_d8,"CAPACITY");
                    if (pcVar9 == (char *)0x0) {
                      bVar12 = true;
                      goto LAB_00103994;
                    }
                    _num_vehicles = 0.0;
                    _Var1 = str_to_double(pcVar9,(double *)&num_vehicles);
                    if (!_Var1) {
                      bVar11 = false;
                      parse_error(&local_d8,
                                  "expected valid number for CAPACITY field. Got `%s` instead",
                                  pcVar9);
                    }
                    dVar13 = _num_vehicles;
                    if (_num_vehicles <= 0.0) {
                      dVar13 = 0.0;
                    }
                    instance->vehicle_cap = dVar13;
                  }
                  else {
                    iVar3 = strcmp(pcVar9,"FUNCTION");
                    if (iVar3 == 0) {
                      local_d8._40_8_ = local_d8._40_8_ & 0xffffffff00000000;
                    }
                    else {
                      iVar3 = strcmp(pcVar9,"UPPER_ROW");
                      if (iVar3 != 0) {
                        pcVar7 = "unsupported format `%s` for EDGE_WEIGHT_FORMAT";
                        goto LAB_00103a10;
                      }
                      local_d8.edgew_format = 1;
                    }
                  }
                }
                else {
                  lVar10 = 0;
                  do {
                    lVar8 = lVar10;
                    if (lVar8 + 0x10 == 0x30) {
                      pcVar7 = "Found unsupported EDGE_WEIGHT_TYPE (`%s`)";
                      goto LAB_00103a10;
                    }
                    iVar3 = strcmp(pcVar9,*(char **)((long)&SUPPORTED_EDGEW[0].name + lVar8));
                    lVar10 = lVar8 + 0x10;
                  } while (iVar3 != 0);
                  local_d8.edgew_format = *(undefined4 *)((long)&SUPPORTED_EDGEW[0].fmt + lVar8);
                }
              }
              else {
                _num_vehicles = (double)((ulong)_num_vehicles & 0xffffffff00000000);
                _Var1 = str_to_int32(pcVar9,&num_vehicles);
                if (!_Var1) {
                  bVar11 = false;
                  parse_error(&local_d8,
                              "expected valid integer for DIMENSION field. Got `%s` instead",pcVar9)
                  ;
                }
                iVar3 = num_vehicles;
                if (num_vehicles < 2) {
                  iVar3 = 1;
                }
                instance->num_customers = iVar3 + -1;
              }
            }
            else {
              iVar3 = strcmp(pcVar9,"CVRP");
              if (iVar3 != 0) {
                pcVar7 = "only CVRP type is supported. Found `%s` instead";
LAB_00103a10:
                bVar11 = false;
                parse_error(&local_d8,pcVar7,pcVar9);
              }
            }
          }
          else {
            pcVar7 = strdup(pcVar9);
            instance->comment = pcVar7;
          }
        }
        else {
          instance_set_name(instance,pcVar9);
        }
        bVar12 = false;
      }
LAB_001039c2:
      free(pcVar9);
    } while (bVar11);
    if (bVar11) {
      if (instance->num_customers < 1) {
        pcVar9 = "couldn\'t deduce number of customers after parsing the VRPLIB header";
      }
      else {
        if (0.0 < instance->vehicle_cap) {
          _Var1 = prep_memory(instance);
          if (_Var1) {
            bVar12 = local_d8.edgew_format == EDGE_WEIGHT_FORMAT_EXPLICIT;
            if (bVar12) {
              pdVar6 = (double *)
                       malloc((long)(((instance->num_customers + 1) * instance->num_customers) / 2)
                              << 3);
              instance->edge_weight = pdVar6;
              if (pdVar6 == (double *)0x0) {
                iVar3 = 0x2c9;
                goto LAB_00103e54;
              }
            }
            sections[0].name = "NODE_COORD_SECTION";
            sections[0].parse_fn = parse_vrplib_nodecoord_section;
            sections[0].required = true;
            sections[0].found = false;
            sections[1].name = "DEMAND_SECTION";
            sections[1].parse_fn = parse_vrplib_demand_section;
            sections[1].required = true;
            sections[1].found = false;
            sections[2].name = "DEPOT_SECTION";
            sections[2].parse_fn = parse_vrplib_depot_section;
            sections[2].required = true;
            sections[2].found = false;
            sections[3].name = "PROFIT_SECTION";
            sections[3].parse_fn = parse_vrplib_profit_section;
            sections[3].required = false;
            sections[3].found = false;
            sections[4].name = "EDGE_WEIGHT_SECTION";
            sections[4].parse_fn = parse_vrplib_edge_weight_section;
            sections[4].found = false;
            bVar11 = true;
            sections[4].required = bVar12;
LAB_00103d46:
            if (bVar11) {
              if ((local_d8.base + (local_d8.size - (long)local_d8.at) == (char *)0x0) ||
                 (_Var1 = parser_match_string(&local_d8,"EOF"), _Var1)) {
                parser_eat_all_blanks(&local_d8);
                if (local_d8.base + (local_d8.size - (long)local_d8.at) != (char *)0x0) {
                  pcVar9 = "Found premature `EOF` while more input is still available";
                  goto LAB_00103e25;
                }
                lVar10 = 0;
                goto LAB_00103e84;
              }
              for (lVar10 = 0; lVar10 != 0x78; lVar10 = lVar10 + 0x18) {
                pcVar9 = *(char **)((long)&sections[0].name + lVar10);
                _Var1 = parser_match_string(&local_d8,pcVar9);
                if ((_Var1) && (_Var1 = parser_match_newline(&local_d8), _Var1)) {
                  if ((&sections[0].found)[lVar10] != true) {
                    (&sections[0].found)[lVar10] = true;
                    cVar2 = (**(code **)((long)&sections[0].parse_fn + lVar10))(&local_d8,instance);
                    bVar11 = true;
                    if (cVar2 == '\0') {
                      bVar11 = false;
                      parse_error(&local_d8,"Failure while parsing section `%s`",pcVar9);
                    }
                    goto LAB_00103d46;
                  }
                  parse_error(&local_d8,"Multiple definitions for section `%s`",pcVar9);
                  break;
                }
              }
              bVar11 = false;
              parse_error(&local_d8,"invalid input");
              goto LAB_00103d46;
            }
          }
          else {
            iVar3 = 0x2bd;
LAB_00103e54:
            bVar11 = false;
            log_log(0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
                    ,iVar3,"Failed to prepare memory for storing instance");
          }
          goto LAB_00103ef1;
        }
        pcVar9 = "couldn\'t deduce vehicle capacity after parsing the VRPLIB header";
      }
LAB_00103e25:
      bVar11 = false;
      parse_error(&local_d8,pcVar9);
      goto LAB_00103ef1;
    }
  }
  goto LAB_00103eee;
LAB_00103e84:
  if (lVar10 == 0x78) goto LAB_00103ec7;
  if (((&sections[0].required)[lVar10] == true) && ((&sections[0].found)[lVar10] != true)) {
    bVar11 = false;
    parse_error(&local_d8,"Required section `%s` was not found",
                *(undefined8 *)((long)&sections[0].name + lVar10));
    goto LAB_00103ef1;
  }
  lVar10 = lVar10 + 0x18;
  goto LAB_00103e84;
LAB_00103ec7:
  if ((*instance->demands == 0.0) && (!NAN(*instance->demands))) goto LAB_00103ef1;
  parse_error(&local_d8,"demand for the depot node should be `0`. Got `%f` instead");
LAB_00103eee:
  bVar11 = false;
LAB_00103ef1:
  free(__ptr);
  return bVar11;
}

Assistant:

bool parse_vrp_file(Instance *instance, FILE *filehandle,
                    const char *filepath) {

    bool result = true;
    size_t filesize = get_file_size(filehandle);

    // + 1 for null termination
    char *buffer = malloc(filesize + 1);
    if (!buffer) {
        result = false;
        goto terminate;
    }

    size_t readamt = fread(buffer, 1, filesize, filehandle);
    if (readamt != filesize) {
        result = false;
        goto terminate;
    }

    // NULL terminate the buffer
    buffer[filesize] = 0;
    VrplibParser parser = {0};
    parser.filename = filepath;
    parser.base = buffer;
    parser.at = buffer;
    parser.size = filesize;

    // First extract the header information
    if (!parse_vrplib_hdr(&parser, instance)) {
        result = false;
        goto terminate;
    }

    if (instance->num_customers <= 0) {
        parse_error(&parser, "couldn't deduce number of customers after "
                             "parsing the VRPLIB header");
        result = false;
        goto terminate;
    } else if (instance->vehicle_cap <= 0.0) {
        parse_error(&parser, "couldn't deduce vehicle capacity after "
                             "parsing the VRPLIB header");
        result = false;
        goto terminate;
    }

    if (!prep_memory(instance)) {
        log_fatal("Failed to prepare memory for storing instance");
        result = false;
        goto terminate;
    }

    bool needs_edge_section = parser_needs_edge_section(&parser);

    if (needs_edge_section) {
        instance->edge_weight =
            malloc(hm_nentries(1 + instance->num_customers) *
                   sizeof(*instance->edge_weight));
        if (!instance->edge_weight) {
            log_fatal("Failed to prepare memory for storing instance");
            result = false;
            goto terminate;
        }
    }

    struct {
        char *name;
        bool (*parse_fn)(VrplibParser *p, Instance *instance);
        bool required;
        bool found;
    } sections[] = {
        {"NODE_COORD_SECTION", parse_vrplib_nodecoord_section, 1, 0},
        {"DEMAND_SECTION", parse_vrplib_demand_section, 1, 0},
        {"DEPOT_SECTION", parse_vrplib_depot_section, 1, 0},
        {"PROFIT_SECTION", parse_vrplib_profit_section, 0, 0},
        {"EDGE_WEIGHT_SECTION", parse_vrplib_edge_weight_section,
         needs_edge_section, 0},
    };

    while (result) {
        bool done =
            parser_is_eof(&parser) || parser_match_string(&parser, "EOF");
        if (done) {
            break;
        }

        bool found_matching_section = false;
        for (int32_t secid = 0; secid < ARRAY_LEN_i32(sections); secid++) {
            if (parser_match_string(&parser, sections[secid].name) &&
                parser_match_newline(&parser)) {
                if (sections[secid].found) {
                    parse_error(&parser,
                                "Multiple definitions for section `%s`",
                                sections[secid].name);
                    result = false;
                    break;
                }

                sections[secid].found = true;
                found_matching_section = true;
                result = sections[secid].parse_fn(&parser, instance);
                if (!result) {
                    parse_error(&parser, "Failure while parsing section `%s`",
                                sections[secid].name);
                    result = false;
                }
                break;
            }
        }
        if (!found_matching_section) {
            parse_error(&parser, "invalid input");
            result = false;
        }
    }

    if (result) {

        // Keep eating whitespaces and newlines while there are any
        parser_eat_all_blanks(&parser);

        if (parser_remainder_size(&parser) != 0) {
            parse_error(&parser, "Found premature `EOF` while more input "
                                 "is still available");
            result = false;
            goto terminate;
        }

        for (int32_t secid = 0; secid < ARRAY_LEN_i32(sections); secid++) {
            if (sections[secid].required && !sections[secid].found) {
                parse_error(&parser, "Required section `%s` was not found",
                            sections[secid].name);
                result = false;
                goto terminate;
            }
        }

        if (instance->demands[0] != 0) {
            parse_error(
                &parser,
                "demand for the depot node should be `0`. Got `%f` instead",
                instance->demands[0]);
            result = false;
            goto terminate;
        }
    }

terminate:
    if (buffer) {
        free(buffer);
    }
    return result;
}